

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclWriteScl(char *pFileName,SC_Lib *p)

{
  int iVar1;
  Vec_Str_t *vOut_00;
  FILE *__s;
  char *__ptr;
  FILE *pFile;
  Vec_Str_t *vOut;
  SC_Lib *p_local;
  char *pFileName_local;
  
  vOut_00 = Vec_StrAlloc(10000);
  Abc_SclWriteLibrary(vOut_00,p);
  iVar1 = Vec_StrSize(vOut_00);
  if (0 < iVar1) {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",pFileName);
    }
    else {
      __ptr = Vec_StrArray(vOut_00);
      iVar1 = Vec_StrSize(vOut_00);
      fwrite(__ptr,1,(long)iVar1,__s);
      fclose(__s);
    }
  }
  Vec_StrFree(vOut_00);
  return;
}

Assistant:

void Abc_SclWriteScl( char * pFileName, SC_Lib * p )
{
    Vec_Str_t * vOut;
    vOut = Vec_StrAlloc( 10000 );
    Abc_SclWriteLibrary( vOut, p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFree( vOut );    
}